

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity_factory.cxx
# Opt level: O2

cse_abstract * __thiscall xr_entity_factory::create(xr_entity_factory *this,char *name)

{
  bool bVar1;
  int iVar2;
  xr_ini_file *this_00;
  anon_union_8_3_e9edf90f_for_xr_clsid_0 pred;
  __normal_iterator<factory_item_base_**,_std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>_>
  _Var3;
  undefined4 extraout_var;
  xr_clsid clsid;
  char clsid_name [9];
  cse_abstract *pcVar4;
  
  this_00 = this->m_system_ini;
  if (this_00 == (xr_ini_file *)0x0) {
    this_00 = (xr_ini_file *)operator_new(0x18);
    xray_re::xr_ini_file::xr_ini_file(this_00,"$game_config$","system.ltx");
    this->m_system_ini = this_00;
  }
  bVar1 = xray_re::xr_ini_file::section_exist(this_00,name);
  if (bVar1) {
    pred.quad = xray_re::xr_ini_file::r_clsid(this->m_system_ini,name,"class");
    clsid.field_0 =
         (anon_union_8_3_e9edf90f_for_xr_clsid_0)(anon_union_8_3_e9edf90f_for_xr_clsid_0)pred.quad;
    _Var3 = xray_re::
            lower_bound_if<__gnu_cxx::__normal_iterator<factory_item_base**,std::vector<factory_item_base*,std::allocator<factory_item_base*>>>,clsid_pred2>
                      ((__normal_iterator<factory_item_base_**,_std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>_>
                        )(this->m_clsids).
                         super__Vector_base<factory_item_base_*,_std::allocator<factory_item_base_*>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                       (__normal_iterator<factory_item_base_**,_std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>_>
                        )(this->m_clsids).
                         super__Vector_base<factory_item_base_*,_std::allocator<factory_item_base_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish,(clsid_pred2)pred);
    if ((_Var3._M_current ==
         (this->m_clsids).
         super__Vector_base<factory_item_base_*,_std::allocator<factory_item_base_*>_>._M_impl.
         super__Vector_impl_data._M_finish) ||
       (((*_Var3._M_current)->m_clsid).field_0.quad != pred.quad)) {
      clsid_name[8] = '\0';
      clsid_name[0] = '\0';
      clsid_name[1] = '\0';
      clsid_name[2] = '\0';
      clsid_name[3] = '\0';
      clsid_name[4] = '\0';
      clsid_name[5] = '\0';
      clsid_name[6] = '\0';
      clsid_name[7] = '\0';
      xray_re::xr_clsid::get(&clsid,clsid_name);
      pcVar4 = (cse_abstract *)0x0;
      xray_re::msg("can\'t create entity %s, %s",name,clsid_name);
    }
    else {
      iVar2 = (*(*_Var3._M_current)->_vptr_factory_item_base[2])();
      pcVar4 = (cse_abstract *)CONCAT44(extraout_var,iVar2);
    }
  }
  else {
    pcVar4 = (cse_abstract *)0x0;
    xray_re::msg("can\'t find entity %s",name);
  }
  return pcVar4;
}

Assistant:

cse_abstract* xr_entity_factory::create(const char* name)
{
	if (m_system_ini == 0)
		m_system_ini = new xr_ini_file(PA_GAME_CONFIG, "system.ltx");

	if (!m_system_ini->section_exist(name)) {
		msg("can't find entity %s", name);
		return 0;
	}

	xr_clsid clsid(m_system_ini->r_clsid(name, "class"));
	std::vector<factory_item_base*>::iterator it = lower_bound_if(
			m_clsids.begin(), m_clsids.end(), clsid_pred2(clsid));
	if (it != m_clsids.end() && (*it)->clsid() == clsid)
		return (*it)->create();

	char clsid_name[9] = {};
	clsid.get(clsid_name);
	msg("can't create entity %s, %s", name, clsid_name);
	return 0;
}